

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O2

void __thiscall
UnscentedKalmanFilterBase_init_Test::TestBody(UnscentedKalmanFilterBase_init_Test *this)

{
  T *this_00;
  char *pcVar1;
  undefined1 local_dc [8];
  ConcreteUKF<Kalman::Vector<float,_3>_> ukf;
  AssertionResult gtest_ar;
  AssertHelper local_18;
  
  Kalman::UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>::UnscentedKalmanFilterBase
            ((UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_> *)local_dc,1.0,2.0,1.0);
  this_00 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)this_00,"0","ukf.x[0]",0.0,(float)local_dc._0_4_);
  if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0') {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x1b,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)this_00,"0","ukf.x[1]",0.0,(float)local_dc._4_4_);
    if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)this_00,"0","ukf.x[2]",0.0,
                 ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                 super_KalmanFilterBase<Kalman::Vector<float,_3>_>.x.super_Matrix<float,_3,_1>.
                 super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [0]);
      if (ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma._0_1_ == '\0') {
        testing::Message::Message((Message *)&gtest_ar.message_);
        if (gtest_ar._0_8_ == 0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_18,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
                   ,0x1d,pcVar1);
        testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
        testing::internal::AssertHelper::~AssertHelper(&local_18);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar.message_);
      }
      goto LAB_00183ca3;
    }
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilterBase.cpp"
               ,0x1c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&gtest_ar.message_);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_18);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar.message_);
LAB_00183ca3:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, init) {
    auto ukf = ConcreteUKF<Vector<T, 3>>(1,2,1);
    
    // x should be zero
    ASSERT_FLOAT_EQ(0, ukf.x[0]);
    ASSERT_FLOAT_EQ(0, ukf.x[1]);
    ASSERT_FLOAT_EQ(0, ukf.x[2]);
}